

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

uint If_DsdManCheckXY(If_DsdMan_t *p,int iDsd,int LutSize,int fDerive,uint uMaskNot,int fHighEffort,
                     int fVerbose)

{
  int nVars_00;
  word *pTruth;
  word *pRes;
  uint local_28;
  int nVars;
  uint uSet;
  int fHighEffort_local;
  uint uMaskNot_local;
  int fDerive_local;
  int LutSize_local;
  int iDsd_local;
  If_DsdMan_t *p_local;
  
  local_28 = If_DsdManCheckXY_int(p,iDsd,LutSize,fDerive,uMaskNot,fVerbose);
  if ((local_28 == 0) && (fHighEffort != 0)) {
    nVars_00 = If_DsdVecLitSuppSize(&p->vObjs,iDsd);
    pTruth = If_DsdManComputeTruth(p,iDsd,(uchar *)0x0);
    local_28 = If_ManSatCheckXYall(p->pSat,LutSize,pTruth,nVars_00,p->vTemp1);
  }
  return local_28;
}

Assistant:

unsigned If_DsdManCheckXY( If_DsdMan_t * p, int iDsd, int LutSize, int fDerive, unsigned uMaskNot, int fHighEffort, int fVerbose )
{
    unsigned uSet = If_DsdManCheckXY_int( p, iDsd, LutSize, fDerive, uMaskNot, fVerbose );
    if ( uSet == 0 && fHighEffort )
    {
//        abctime clk = Abc_Clock();
        int nVars = If_DsdVecLitSuppSize( &p->vObjs, iDsd );
        word * pRes = If_DsdManComputeTruth( p, iDsd, NULL );
        uSet = If_ManSatCheckXYall( p->pSat, LutSize, pRes, nVars, p->vTemp1 );
        if ( uSet )
        {
//            If_DsdManPrintOne( stdout, p, Abc_Lit2Var(iDsd), NULL, 1 );
//            Dau_DecPrintSet( uSet, nVars, 1 );
        }
//        p->timeCheck2 += Abc_Clock() - clk;
    }
    return uSet;
}